

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aescrypt2.c
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  char *pcVar2;
  int *__s;
  uchar *input;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  mbedtls_md_info_t *md_info;
  FILE *pFVar6;
  FILE *__s_00;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  undefined8 *__s_01;
  bool bVar13;
  uint n;
  uchar IV [16];
  mbedtls_md_context_t sha_ctx;
  uchar tmp [16];
  mbedtls_aes_context aes_ctx;
  uchar key [512];
  uchar buffer [1024];
  uint local_7e0;
  uint local_7dc;
  FILE *local_7d8;
  ulong local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  char **local_7b8;
  mbedtls_md_context_t local_7b0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  size_t local_770;
  undefined8 local_768;
  undefined8 uStack_760;
  mbedtls_aes_context local_758;
  uchar local_638 [512];
  undefined8 local_438;
  undefined8 uStack_430;
  
  mbedtls_aes_init(&local_758);
  mbedtls_md_init(&local_7b0);
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
  iVar4 = mbedtls_md_setup(&local_7b0,md_info,1);
  if (iVar4 == 0) {
    if (argc == 5) {
      uVar5 = atoi(argv[1]);
      local_7c8 = 0;
      uStack_7c0 = 0;
      memset(local_638,0,0x200);
      local_798 = 0;
      uStack_790 = 0;
      local_788 = 0;
      uStack_780 = 0;
      __s_01 = &local_438;
      memset(__s_01,0,0x400);
      local_7dc = uVar5;
      if (uVar5 < 2) {
        pcVar2 = argv[2];
        iVar4 = strcmp(pcVar2,argv[3]);
        if (iVar4 == 0) {
          main_cold_13();
        }
        else {
          ppcVar1 = argv + 2;
          pFVar6 = fopen(pcVar2,"rb");
          if (pFVar6 != (FILE *)0x0) {
            __s_00 = fopen(argv[3],"wb+");
            if (__s_00 == (FILE *)0x0) {
              main_cold_11();
              iVar4 = 0;
              goto LAB_001035ff;
            }
            local_7d8 = pFVar6;
            pFVar6 = fopen(argv[4],"rb");
            local_7b8 = ppcVar1;
            if (pFVar6 == (FILE *)0x0) {
              __s = (int *)argv[4];
              if (*__s == 0x3a786568) {
                iVar4 = __isoc99_sscanf(__s + 1,"%02X",&local_7e0);
                if (iVar4 < 1) {
                  sVar7 = 0;
                }
                else {
                  lVar11 = (long)__s + 6;
                  uVar12 = 0;
                  do {
                    sVar7 = uVar12 + 1;
                    local_638[uVar12] = (uchar)local_7e0;
                    iVar4 = __isoc99_sscanf(lVar11,"%02X",&local_7e0);
                    if (iVar4 < 1) break;
                    lVar11 = lVar11 + 2;
                    bVar13 = uVar12 < 0x1ff;
                    uVar12 = sVar7;
                  } while (bVar13);
                }
              }
              else {
                sVar8 = strlen((char *)__s);
                sVar7 = 0x200;
                if (sVar8 < 0x200) {
                  sVar7 = sVar8;
                }
                memcpy(local_638,__s,sVar7);
              }
            }
            else {
              sVar7 = fread(local_638,1,0x200,pFVar6);
              fclose(pFVar6);
            }
            pFVar6 = local_7d8;
            local_770 = sVar7;
            iVar4 = fileno(local_7d8);
            uVar12 = lseek(iVar4,0,2);
            if ((long)uVar12 < 0) {
              perror("lseek");
LAB_00103d33:
              iVar4 = 0;
              goto LAB_00103602;
            }
            local_7d0 = uVar12;
            iVar4 = fseek(pFVar6,0,0);
            uVar12 = local_7d0;
            if (iVar4 < 0) {
              main_cold_10();
            }
            else if ((local_7dc & 1) == 0) {
              lVar11 = 0;
              do {
                *(char *)__s_01 = (char)(local_7d0 >> ((byte)lVar11 & 0x3f));
                __s_01 = (undefined8 *)((long)__s_01 + 1);
                lVar11 = lVar11 + 8;
              } while (lVar11 != 0x40);
              input = (uchar *)*local_7b8;
              mbedtls_md_starts(&local_7b0);
              mbedtls_md_update(&local_7b0,(uchar *)&local_438,8);
              sVar7 = strlen((char *)input);
              mbedtls_md_update(&local_7b0,input,sVar7);
              mbedtls_md_finish(&local_7b0,(uchar *)&local_798);
              local_7c8 = local_798;
              uStack_7c0._7_1_ = (byte)((ulong)uStack_790 >> 0x38);
              uStack_7c0 = CONCAT17(uStack_7c0._7_1_ & 0xf0 | (byte)uVar12 & 0xf,(int7)uStack_790);
              sVar8 = fwrite(&local_7c8,1,0x10,__s_00);
              sVar7 = local_770;
              if (sVar8 == 0x10) {
                local_788 = 0;
                uStack_780 = 0;
                local_798 = local_7c8;
                uStack_790 = uStack_7c0;
                iVar4 = 0x2000;
                do {
                  mbedtls_md_starts(&local_7b0);
                  mbedtls_md_update(&local_7b0,(uchar *)&local_798,0x20);
                  mbedtls_md_update(&local_7b0,local_638,sVar7);
                  mbedtls_md_finish(&local_7b0,(uchar *)&local_798);
                  iVar4 = iVar4 + -1;
                } while (iVar4 != 0);
                mbedtls_aes_setkey_enc(&local_758,(uchar *)&local_798,0x100);
                mbedtls_md_hmac_starts(&local_7b0,(uchar *)&local_798,0x20);
                if (local_7d0 != 0) {
                  lVar11 = 0;
                  do {
                    uVar12 = local_7d0 - lVar11;
                    if (0xf < (long)uVar12) {
                      uVar12 = 0x10;
                    }
                    local_7e0 = (uint)uVar12;
                    sVar7 = fread(&local_438,1,uVar12 & 0xffffffff,local_7d8);
                    if (sVar7 != local_7e0) {
                      fprintf(_stderr,"fread(%d bytes) failed\n");
                      pFVar6 = local_7d8;
                      goto LAB_00103d53;
                    }
                    lVar9 = 0;
                    do {
                      *(byte *)((long)&local_438 + lVar9) =
                           *(byte *)((long)&local_438 + lVar9) ^ *(byte *)((long)&local_7c8 + lVar9)
                      ;
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 0x10);
                    mbedtls_aes_crypt_ecb(&local_758,1,(uchar *)&local_438,(uchar *)&local_438);
                    mbedtls_md_hmac_update(&local_7b0,(uchar *)&local_438,0x10);
                    sVar7 = fwrite(&local_438,1,0x10,__s_00);
                    if (sVar7 != 0x10) {
                      main_cold_2();
                      pFVar6 = local_7d8;
                      goto LAB_00103d53;
                    }
                    local_7c8 = local_438;
                    uStack_7c0 = uStack_430;
                    lVar11 = lVar11 + 0x10;
                  } while (lVar11 < (long)local_7d0);
                }
                mbedtls_md_hmac_finish(&local_7b0,(uchar *)&local_798);
                sVar7 = fwrite(&local_798,1,0x20,__s_00);
                if (sVar7 == 0x20) {
                  pFVar6 = local_7d8;
                  if (local_7dc == 1) goto LAB_001039a6;
                }
                else {
                  main_cold_3();
                  pFVar6 = local_7d8;
                }
              }
              else {
                main_cold_1();
                pFVar6 = local_7d8;
              }
            }
            else {
LAB_001039a6:
              if ((long)local_7d0 < 0x30) {
                main_cold_9();
              }
              else if ((local_7d0 & 0xf) == 0) {
                sVar8 = fread(&local_438,1,0x10,pFVar6);
                sVar7 = local_770;
                if (sVar8 == 0x10) {
                  local_7b8 = (char **)(local_7d0 - 0x30);
                  local_7c8 = local_438;
                  uStack_7c0 = uStack_430;
                  uVar3 = uStack_7c0;
                  uStack_7c0._7_1_ = (byte)((ulong)uStack_430 >> 0x38);
                  local_7dc = uStack_7c0._7_1_ & 0xf;
                  local_788 = 0;
                  uStack_780 = 0;
                  local_798 = local_438;
                  uStack_790 = uStack_430;
                  iVar4 = 0x2000;
                  uStack_7c0 = uVar3;
                  do {
                    mbedtls_md_starts(&local_7b0);
                    mbedtls_md_update(&local_7b0,(uchar *)&local_798,0x20);
                    mbedtls_md_update(&local_7b0,local_638,sVar7);
                    mbedtls_md_finish(&local_7b0,(uchar *)&local_798);
                    iVar4 = iVar4 + -1;
                  } while (iVar4 != 0);
                  mbedtls_aes_setkey_dec(&local_758,(uchar *)&local_798,0x100);
                  mbedtls_md_hmac_starts(&local_7b0,(uchar *)&local_798,0x20);
                  ppcVar1 = local_7b8;
                  pFVar6 = local_7d8;
                  if (local_7d0 != 0x30) {
                    local_7d0 = local_7d0 - 0x40;
                    uVar12 = 0;
                    do {
                      sVar7 = fread(&local_438,1,0x10,pFVar6);
                      if (sVar7 != 0x10) {
                        main_cold_6();
                        goto LAB_00103d33;
                      }
                      local_768 = local_438;
                      uStack_760 = uStack_430;
                      mbedtls_md_hmac_update(&local_7b0,(uchar *)&local_438,0x10);
                      mbedtls_aes_crypt_ecb(&local_758,0,(uchar *)&local_438,(uchar *)&local_438);
                      lVar11 = 0;
                      do {
                        *(byte *)((long)&local_438 + lVar11) =
                             *(byte *)((long)&local_438 + lVar11) ^
                             *(byte *)((long)&local_7c8 + lVar11);
                        lVar11 = lVar11 + 1;
                      } while (lVar11 != 0x10);
                      local_7e0 = 0x10;
                      if (uVar12 == local_7d0) {
                        local_7e0 = local_7dc;
                      }
                      local_7c8 = local_768;
                      uStack_7c0 = uStack_760;
                      if ((char)local_7dc == '\0') {
                        local_7e0 = 0x10;
                      }
                      sVar7 = fwrite(&local_438,1,(ulong)local_7e0,__s_00);
                      if (sVar7 != local_7e0) {
                        fprintf(_stderr,"fwrite(%d bytes) failed\n");
                        goto LAB_00103d33;
                      }
                      uVar12 = uVar12 + 0x10;
                    } while ((long)uVar12 < (long)ppcVar1);
                  }
                  mbedtls_md_hmac_finish(&local_7b0,(uchar *)&local_798);
                  sVar7 = fread(&local_438,1,0x20,pFVar6);
                  if (sVar7 == 0x20) {
                    lVar11 = 0;
                    bVar10 = 0;
                    do {
                      bVar10 = bVar10 | *(byte *)((long)&local_438 + lVar11) ^
                                        *(byte *)((long)&local_798 + lVar11);
                      lVar11 = lVar11 + 1;
                    } while (lVar11 != 0x20);
                    iVar4 = 0;
                    if (bVar10 != 0) {
                      main_cold_8();
                      iVar4 = 0;
                    }
                  }
                  else {
                    main_cold_7();
                    iVar4 = 0;
                  }
                  goto LAB_00103602;
                }
                main_cold_5();
              }
              else {
                main_cold_4();
              }
            }
LAB_00103d53:
            iVar4 = 0;
            goto LAB_00103602;
          }
          main_cold_12();
        }
      }
      else {
        main_cold_14();
      }
    }
    else {
      puts(
          "\n  aescrypt2 <mode> <input filename> <output filename> <key>\n\n   <mode>: 0 = encrypt, 1 = decrypt\n\n  example: aescrypt2 0 file file.aes hex:E76B2413958B00E193\n"
          );
    }
    iVar4 = 0;
    pFVar6 = (FILE *)0x0;
  }
  else {
    pFVar6 = (FILE *)0x0;
    printf("  ! mbedtls_md_setup() returned -0x%04x\n");
  }
LAB_001035ff:
  __s_00 = (FILE *)0x0;
LAB_00103602:
  if (pFVar6 != (FILE *)0x0) {
    fclose(pFVar6);
  }
  if (__s_00 != (FILE *)0x0) {
    fclose(__s_00);
  }
  if (argc != 0) {
    uVar12 = 0;
    do {
      pcVar2 = argv[uVar12];
      sVar7 = strlen(pcVar2);
      memset(pcVar2,0,sVar7);
      uVar12 = uVar12 + 1;
    } while ((uint)argc != uVar12);
  }
  local_7c8 = 0;
  uStack_7c0 = 0;
  memset(local_638,0,0x200);
  local_768 = 0;
  uStack_760 = 0;
  memset(&local_438,0,0x400);
  local_798 = 0;
  uStack_790 = 0;
  local_788 = 0;
  uStack_780 = 0;
  mbedtls_aes_free(&local_758);
  mbedtls_md_free(&local_7b0);
  return iVar4;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;

    unsigned int i, n;
    int mode, lastn;
    size_t keylen;
    FILE *fkey, *fin = NULL, *fout = NULL;

    char *p;

    unsigned char IV[16];
    unsigned char tmp[16];
    unsigned char key[512];
    unsigned char digest[32];
    unsigned char buffer[1024];
    unsigned char diff;

    mbedtls_aes_context aes_ctx;
    mbedtls_md_context_t sha_ctx;

#if defined(_WIN32_WCE)
    long filesize, offset;
#elif defined(_WIN32)
       LARGE_INTEGER li_size;
    __int64 filesize, offset;
#else
      off_t filesize, offset;
#endif

    mbedtls_aes_init( &aes_ctx );
    mbedtls_md_init( &sha_ctx );

    ret = mbedtls_md_setup( &sha_ctx, mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ), 1 );
    if( ret != 0 )
    {
        mbedtls_printf( "  ! mbedtls_md_setup() returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * Parse the command-line arguments.
     */
    if( argc != 5 )
    {
        mbedtls_printf( USAGE );

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        goto exit;
    }

    mode = atoi( argv[1] );
    memset( IV,     0, sizeof( IV ) );
    memset( key,    0, sizeof( key ) );
    memset( digest, 0, sizeof( digest ) );
    memset( buffer, 0, sizeof( buffer ) );

    if( mode != MODE_ENCRYPT && mode != MODE_DECRYPT )
    {
        mbedtls_fprintf( stderr, "invalide operation mode\n" );
        goto exit;
    }

    if( strcmp( argv[2], argv[3] ) == 0 )
    {
        mbedtls_fprintf( stderr, "input and output filenames must differ\n" );
        goto exit;
    }

    if( ( fin = fopen( argv[2], "rb" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,rb) failed\n", argv[2] );
        goto exit;
    }

    if( ( fout = fopen( argv[3], "wb+" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,wb+) failed\n", argv[3] );
        goto exit;
    }

    /*
     * Read the secret key from file or command line
     */
    if( ( fkey = fopen( argv[4], "rb" ) ) != NULL )
    {
        keylen = fread( key, 1, sizeof( key ), fkey );
        fclose( fkey );
    }
    else
    {
        if( memcmp( argv[4], "hex:", 4 ) == 0 )
        {
            p = &argv[4][4];
            keylen = 0;

            while( sscanf( p, "%02X", &n ) > 0 &&
                   keylen < (int) sizeof( key ) )
            {
                key[keylen++] = (unsigned char) n;
                p += 2;
            }
        }
        else
        {
            keylen = strlen( argv[4] );

            if( keylen > (int) sizeof( key ) )
                keylen = (int) sizeof( key );

            memcpy( key, argv[4], keylen );
        }
    }

#if defined(_WIN32_WCE)
    filesize = fseek( fin, 0L, SEEK_END );
#else
#if defined(_WIN32)
    /*
     * Support large files (> 2Gb) on Win32
     */
    li_size.QuadPart = 0;
    li_size.LowPart  =
        SetFilePointer( (HANDLE) _get_osfhandle( _fileno( fin ) ),
                        li_size.LowPart, &li_size.HighPart, FILE_END );

    if( li_size.LowPart == 0xFFFFFFFF && GetLastError() != NO_ERROR )
    {
        mbedtls_fprintf( stderr, "SetFilePointer(0,FILE_END) failed\n" );
        goto exit;
    }

    filesize = li_size.QuadPart;
#else
    if( ( filesize = lseek( fileno( fin ), 0, SEEK_END ) ) < 0 )
    {
        perror( "lseek" );
        goto exit;
    }
#endif
#endif

    if( fseek( fin, 0, SEEK_SET ) < 0 )
    {
        mbedtls_fprintf( stderr, "fseek(0,SEEK_SET) failed\n" );
        goto exit;
    }

    if( mode == MODE_ENCRYPT )
    {
        /*
         * Generate the initialization vector as:
         * IV = SHA-256( filesize || filename )[0..15]
         */
        for( i = 0; i < 8; i++ )
            buffer[i] = (unsigned char)( filesize >> ( i << 3 ) );

        p = argv[2];

        mbedtls_md_starts( &sha_ctx );
        mbedtls_md_update( &sha_ctx, buffer, 8 );
        mbedtls_md_update( &sha_ctx, (unsigned char *) p, strlen( p ) );
        mbedtls_md_finish( &sha_ctx, digest );

        memcpy( IV, digest, 16 );

        /*
         * The last four bits in the IV are actually used
         * to store the file size modulo the AES block size.
         */
        lastn = (int)( filesize & 0x0F );

        IV[15] = (unsigned char)
            ( ( IV[15] & 0xF0 ) | lastn );

        /*
         * Append the IV at the beginning of the output.
         */
        if( fwrite( IV, 1, 16, fout ) != 16 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &sha_ctx );
            mbedtls_md_update( &sha_ctx, digest, 32 );
            mbedtls_md_update( &sha_ctx, key, keylen );
            mbedtls_md_finish( &sha_ctx, digest );
        }

        mbedtls_aes_setkey_enc( &aes_ctx, digest, 256 );
        mbedtls_md_hmac_starts( &sha_ctx, digest, 32 );

        /*
         * Encrypt and write the ciphertext.
         */
        for( offset = 0; offset < filesize; offset += 16 )
        {
            n = ( filesize - offset > 16 ) ? 16 : (int)
                ( filesize - offset );

            if( fread( buffer, 1, n, fin ) != (size_t) n )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", n );
                goto exit;
            }

            for( i = 0; i < 16; i++ )
                buffer[i] = (unsigned char)( buffer[i] ^ IV[i] );

            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, buffer, buffer );
            mbedtls_md_hmac_update( &sha_ctx, buffer, 16 );

            if( fwrite( buffer, 1, 16, fout ) != 16 )
            {
                mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
                goto exit;
            }

            memcpy( IV, buffer, 16 );
        }

        /*
         * Finally write the HMAC.
         */
        mbedtls_md_hmac_finish( &sha_ctx, digest );

        if( fwrite( digest, 1, 32, fout ) != 32 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }
    }

    if( mode == MODE_DECRYPT )
    {
        /*
         *  The encrypted file must be structured as follows:
         *
         *        00 .. 15              Initialization Vector
         *        16 .. 31              AES Encrypted Block #1
         *           ..
         *      N*16 .. (N+1)*16 - 1    AES Encrypted Block #N
         *  (N+1)*16 .. (N+1)*16 + 32   HMAC-SHA-256(ciphertext)
         */
        if( filesize < 48 )
        {
            mbedtls_fprintf( stderr, "File too short to be encrypted.\n" );
            goto exit;
        }

        if( ( filesize & 0x0F ) != 0 )
        {
            mbedtls_fprintf( stderr, "File size not a multiple of 16.\n" );
            goto exit;
        }

        /*
         * Subtract the IV + HMAC length.
         */
        filesize -= ( 16 + 32 );

        /*
         * Read the IV and original filesize modulo 16.
         */
        if( fread( buffer, 1, 16, fin ) != 16 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
            goto exit;
        }

        memcpy( IV, buffer, 16 );
        lastn = IV[15] & 0x0F;

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &sha_ctx );
            mbedtls_md_update( &sha_ctx, digest, 32 );
            mbedtls_md_update( &sha_ctx, key, keylen );
            mbedtls_md_finish( &sha_ctx, digest );
        }

        mbedtls_aes_setkey_dec( &aes_ctx, digest, 256 );
        mbedtls_md_hmac_starts( &sha_ctx, digest, 32 );

        /*
         * Decrypt and write the plaintext.
         */
        for( offset = 0; offset < filesize; offset += 16 )
        {
            if( fread( buffer, 1, 16, fin ) != 16 )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
                goto exit;
            }

            memcpy( tmp, buffer, 16 );

            mbedtls_md_hmac_update( &sha_ctx, buffer, 16 );
            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_DECRYPT, buffer, buffer );

            for( i = 0; i < 16; i++ )
                buffer[i] = (unsigned char)( buffer[i] ^ IV[i] );

            memcpy( IV, tmp, 16 );

            n = ( lastn > 0 && offset == filesize - 16 )
                ? lastn : 16;

            if( fwrite( buffer, 1, n, fout ) != (size_t) n )
            {
                mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", n );
                goto exit;
            }
        }

        /*
         * Verify the message authentication code.
         */
        mbedtls_md_hmac_finish( &sha_ctx, digest );

        if( fread( buffer, 1, 32, fin ) != 32 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 32 );
            goto exit;
        }

        /* Use constant-time buffer comparison */
        diff = 0;
        for( i = 0; i < 32; i++ )
            diff |= digest[i] ^ buffer[i];

        if( diff != 0 )
        {
            mbedtls_fprintf( stderr, "HMAC check failed: wrong key, "
                             "or file corrupted.\n" );
            goto exit;
        }
    }

    ret = 0;

exit:
    if( fin )
        fclose( fin );
    if( fout )
        fclose( fout );

    /* Zeroize all command line arguments to also cover
       the case when the user has missed or reordered some,
       in which case the key might not be in argv[4]. */
    for( i = 0; i < (unsigned int) argc; i++ )
        memset( argv[i], 0, strlen( argv[i] ) );

    memset( IV,     0, sizeof( IV ) );
    memset( key,    0, sizeof( key ) );
    memset( tmp,    0, sizeof( tmp ) );
    memset( buffer, 0, sizeof( buffer ) );
    memset( digest, 0, sizeof( digest ) );

    mbedtls_aes_free( &aes_ctx );
    mbedtls_md_free( &sha_ctx );

    return( ret );
}